

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13ValidDNnameConstraintsTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section13ValidDNnameConstraintsTest4
          (Section13ValidDNnameConstraintsTest4<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13ValidDNnameConstraintsTest4) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDN1CACert",
                               "ValidDNnameConstraintsTest4EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN1CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.4";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}